

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

Own<capnp::EzRpcServer::Impl> __thiscall
kj::
heap<capnp::EzRpcServer::Impl,capnp::Capability::Client,sockaddr*&,unsigned_int&,capnp::ReaderOptions&>
          (kj *this,Client *params,sockaddr **params_1,uint *params_2,ReaderOptions *params_3)

{
  undefined8 uVar1;
  undefined4 uVar2;
  ClientHook *pCVar3;
  Impl *pIVar4;
  Impl *extraout_RDX;
  Impl *extraout_RDX_00;
  Own<capnp::EzRpcServer::Impl> OVar5;
  ReaderOptions readerOpts;
  Client local_48;
  
  pIVar4 = (Impl *)operator_new(0x98);
  local_48.hook.disposer = (params->hook).disposer;
  local_48.hook.ptr = (params->hook).ptr;
  (params->hook).ptr = (ClientHook *)0x0;
  uVar1 = params_3->traversalLimitInWords;
  uVar2 = params_3->nestingLimit;
  readerOpts.nestingLimit = uVar2;
  readerOpts.traversalLimitInWords = uVar1;
  readerOpts._12_4_ = 0;
  capnp::EzRpcServer::Impl::Impl(pIVar4,&local_48,*params_1,*params_2,readerOpts);
  pCVar3 = local_48.hook.ptr;
  *(undefined8 **)this = &_::HeapDisposer<capnp::EzRpcServer::Impl>::instance;
  *(Impl **)(this + 8) = pIVar4;
  pIVar4 = extraout_RDX;
  if (local_48.hook.ptr != (ClientHook *)0x0) {
    local_48.hook.ptr = (ClientHook *)0x0;
    (**(local_48.hook.disposer)->_vptr_Disposer)
              (local_48.hook.disposer,pCVar3->_vptr_ClientHook[-2] + (long)&pCVar3->_vptr_ClientHook
              );
    pIVar4 = extraout_RDX_00;
  }
  OVar5.ptr = pIVar4;
  OVar5.disposer = (Disposer *)this;
  return OVar5;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}